

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::setFrontFaceCCW(GLEngine *this,bool newVal)

{
  byte in_SIL;
  long in_RDI;
  
  if ((in_SIL & 1) != (*(byte *)(in_RDI + 0x26c) & 1)) {
    *(byte *)(in_RDI + 0x26c) = in_SIL & 1;
    if ((*(byte *)(in_RDI + 0x26c) & 1) == 0) {
      (*glad_glFrontFace)(0x900);
    }
    else {
      (*glad_glFrontFace)(0x901);
    }
  }
  return;
}

Assistant:

void GLEngine::setFrontFaceCCW(bool newVal) {
  if (newVal == frontFaceCCW) return;
  frontFaceCCW = newVal;
  if (frontFaceCCW) {
    glFrontFace(GL_CCW);
  } else {
    glFrontFace(GL_CW);
  }
}